

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdown-tokens.cpp
# Opt level: O1

string * markdown::token::RawText::_processSpaceBracketedGroupings
                   (string *__return_storage_ptr__,string *src,ReplacementTable *replacements)

{
  bool bVar1;
  int iVar2;
  const_reference pvVar3;
  long *plVar4;
  RawText *p;
  long *plVar5;
  element_type *peVar6;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last;
  smatch m;
  undefined8 local_148;
  long local_140;
  undefined1 local_138;
  undefined7 uStack_137;
  char local_11e [6];
  char *local_118;
  char *local_110;
  shared_ptr<markdown::Token> local_108;
  element_type local_f8;
  long lStack_f0;
  undefined1 *local_e8;
  char *local_e0;
  undefined1 local_d8;
  undefined7 uStack_d7;
  vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
  *local_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  lcast_put_unsigned<std::char_traits<char>,_unsigned_long,_char> local_a0;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_88;
  
  local_c8 = (vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
              *)replacements;
  if (_processSpaceBracketedGroupings(std::__cxx11::string_const&,std::vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>&)
      ::cRemove == '\0') {
    iVar2 = __cxa_guard_acquire(&_processSpaceBracketedGroupings(std::__cxx11::string_const&,std::vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>&)
                                 ::cRemove);
    if (iVar2 != 0) {
      boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
      basic_regex(&_processSpaceBracketedGroupings::cRemove,"(?:(?: \\*+ )|(?: _+ ))",0);
      __cxa_atexit(boost::
                   basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
                   ~basic_regex,&_processSpaceBracketedGroupings::cRemove,&__dso_handle);
      __cxa_guard_release(&_processSpaceBracketedGroupings(std::__cxx11::string_const&,std::vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>&)
                           ::cRemove);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  first._M_current = (src->_M_dataplus)._M_p;
  last._M_current = first._M_current + src->_M_string_length;
  do {
    local_88.m_null.
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .first._M_current = (char *)0x0;
    local_88.m_null.
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .second._M_current = (char *)0x0;
    local_88.m_subs.
    super__Vector_base<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88.m_base._M_current = (char *)0x0;
    local_88.m_subs.
    super__Vector_base<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.m_subs.
    super__Vector_base<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.m_null.matched = false;
    local_88.m_named_subs.px = (element_type *)0x0;
    local_88.m_named_subs.pn.pi_ = (sp_counted_base *)0x0;
    local_88.m_last_closed_paren = 0;
    local_88.m_is_singular = true;
    bVar1 = boost::
            regex_search<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,boost::regex_traits<char,boost::cpp_regex_traits<char>>>
                      (first,last,&local_88,&_processSpaceBracketedGroupings::cRemove,format_default
                       ,first);
    if (bVar1) {
      pvVar3 = boost::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](&local_88,0);
      local_148 = &local_138;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_148,first._M_current,
                 (pvVar3->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_148);
      if (local_148 != &local_138) {
        operator_delete(local_148,CONCAT71(uStack_137,local_138) + 1);
      }
      local_a0.m_value = (long)*(pointer *)(local_c8 + 8) - *(long *)local_c8 >> 4;
      local_e0 = (char *)0x0;
      local_d8 = 0;
      local_118 = (char *)((long)&local_148 + 2);
      local_a0.m_czero = '0';
      local_a0.m_zero = 0x30;
      local_110 = local_11e;
      local_e8 = &local_d8;
      local_a0.m_finish = local_11e;
      local_118 = boost::detail::lcast_put_unsigned<std::char_traits<char>,_unsigned_long,_char>::
                  convert(&local_a0);
      local_110 = local_11e;
      std::__cxx11::string::replace((ulong)&local_e8,0,local_e0,(ulong)local_118);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,0x158235);
      local_c0 = &local_b0;
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_b0 = *plVar5;
        lStack_a8 = plVar4[3];
      }
      else {
        local_b0 = *plVar5;
        local_c0 = (long *)*plVar4;
      }
      local_b8 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_c0);
      local_108.px = &local_f8;
      peVar6 = (element_type *)(plVar4 + 2);
      if ((element_type *)*plVar4 == peVar6) {
        local_f8._vptr_Token = peVar6->_vptr_Token;
        lStack_f0 = plVar4[3];
      }
      else {
        local_f8._vptr_Token = peVar6->_vptr_Token;
        local_108.px = (element_type *)*plVar4;
      }
      local_108.pn.pi_ = (sp_counted_base *)plVar4[1];
      *plVar4 = (long)peVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_108.px);
      if (local_108.px != &local_f8) {
        operator_delete(local_108.px,(long)local_f8._vptr_Token + 1);
      }
      if (local_c0 != &local_b0) {
        operator_delete(local_c0,local_b0 + 1);
      }
      if (local_e8 != &local_d8) {
        operator_delete(local_e8,CONCAT71(uStack_d7,local_d8) + 1);
      }
      p = (RawText *)operator_new(0x30);
      pvVar3 = boost::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](&local_88,0);
      if (pvVar3->matched == true) {
        local_148 = &local_138;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_148,
                   (pvVar3->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,
                   (pvVar3->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
      }
      else {
        local_148 = &local_138;
        local_140 = 0;
        local_138 = 0;
      }
      (p->super_TextHolder).super_Token._vptr_Token = (_func_int **)&PTR__TextHolder_001682d0;
      (p->super_TextHolder).mText._M_dataplus._M_p = (pointer)&(p->super_TextHolder).mText.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&(p->super_TextHolder).mText,local_148,local_148 + local_140);
      (p->super_TextHolder).mCanContainMarkup = true;
      (p->super_TextHolder).mEncodingFlags = 0xd;
      (p->super_TextHolder).super_Token._vptr_Token = (_func_int **)&PTR__TextHolder_00168388;
      boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::RawText>(&local_108,p);
      std::
      vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
      ::emplace_back<boost::shared_ptr<markdown::Token>>(local_c8,&local_108);
      boost::detail::shared_count::~shared_count(&local_108.pn);
      if (local_148 != &local_138) {
        operator_delete(local_148,CONCAT71(uStack_137,local_138) + 1);
      }
      pvVar3 = boost::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](&local_88,0);
      first._M_current =
           (pvVar3->
           super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).second._M_current;
    }
    else {
      local_148 = &local_138;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_148,first._M_current,last._M_current);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_148);
      if (local_148 != &local_138) {
        operator_delete(local_148,CONCAT71(uStack_137,local_138) + 1);
      }
    }
    boost::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~match_results(&local_88);
  } while (bVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string RawText::_processSpaceBracketedGroupings(const std::string &src,
	ReplacementTable& replacements)
{
	static const boost::regex cRemove("(?:(?: \\*+ )|(?: _+ ))");

	std::string tgt;
	std::string::const_iterator prev=src.begin(), end=src.end();
	while (1) {
		boost::smatch m;
		if (boost::regex_search(prev, end, m, cRemove)) {
			tgt+=std::string(prev, m[0].first);
			tgt+="\x01@"+boost::lexical_cast<std::string>(replacements.size())+"@spaceBracketed\x01";
			replacements.push_back(TokenPtr(new RawText(m[0])));
			prev=m[0].second;
		} else {
			tgt+=std::string(prev, end);
			break;
		}
	}
	return tgt;
}